

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O0

bool ddd::utils::match(char *lhs,char *rhs,uint32_t *len)

{
  char cVar1;
  uint32_t *len_local;
  char *rhs_local;
  char *lhs_local;
  
  *len = 0;
  while( true ) {
    if (lhs[*len] == '\0') {
      cVar1 = rhs[*len];
      if (cVar1 == '\0') {
        *len = *len + 1;
      }
      return cVar1 == '\0';
    }
    if (lhs[*len] != rhs[*len]) break;
    *len = *len + 1;
  }
  return false;
}

Assistant:

inline bool match(const char* lhs, const char* rhs, uint32_t& len) {
  len = 0;
  while (lhs[len] != '\0') {
    if (lhs[len] != rhs[len]) {
      return false;
    }
    ++len;
  }
  if (rhs[len] != '\0') {
    return false;
  }
  ++len;
  return true;
}